

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_info.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pMVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  MzpArchiveEntry *header;
  MzpArchiveHeader this;
  ulong uVar7;
  ulong uVar8;
  undefined1 local_88 [8];
  string archive_data;
  Mzp mzp;
  
  if (argc == 2) {
    archive_data._M_dataplus._M_p = (pointer)0x0;
    archive_data._M_string_length._0_1_ = 0;
    local_88 = (undefined1  [8])&archive_data._M_string_length;
    bVar2 = mg::fs::read_file(argv[1],(string *)local_88);
    iVar6 = -1;
    if (bVar2) {
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mzp.header.magic[0] = '\0';
      mzp.header.magic[1] = '\0';
      mzp.header.magic[2] = '\0';
      mzp.header.magic[3] = '\0';
      mzp.header.magic[4] = '\0';
      mzp.header.magic[5] = '\0';
      mzp.header.archive_entry_count = 0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar2 = mg::data::mzp_read((string *)local_88,(Mzp *)((long)&archive_data.field_2 + 8));
      if (bVar2) {
        iVar6 = 0;
        fprintf(_stderr,"MZP archive of %lu elements:\n",
                (long)mzp.entry_headers.
                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)mzp.header >> 3);
        pMVar1 = mzp.entry_headers.
                 super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (this = mzp.header; this != (MzpArchiveHeader)pMVar1;
            this = (MzpArchiveHeader)((long)this + 8)) {
          mg::data::Mzp::MzpArchiveEntry::print((MzpArchiveEntry *)this);
        }
        if ((MzpArchiveHeader)
            mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_start != mzp.header) {
          uVar7 = 0;
          do {
            uVar8 = (ulong)((int)uVar7 + 1);
            uVar5 = uVar8;
            if (uVar8 < (ulong)((long)mzp.entry_headers.
                                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)mzp.header
                               >> 3)) {
              do {
                uVar3 = (uint)*(ushort *)((long)mzp.header + 2 + uVar7 * 8) +
                        (uint)*(ushort *)((long)mzp.header + uVar7 * 8) * 0x800;
                uVar4 = (uint)*(ushort *)((long)mzp.header + 2 + uVar5 * 8) +
                        (uint)*(ushort *)((long)mzp.header + uVar5 * 8) * 0x800;
                if ((uVar3 <= uVar4) &&
                   (uVar4 <= uVar3 + *(ushort *)((long)mzp.header + 6 + uVar7 * 8) +
                             (*(ushort *)((long)mzp.header + 4 + uVar7 * 8) & 0xffe0) * 0x800)) {
                  fprintf(_stderr,"Entry %u begins inside of entry %u\n",uVar5,uVar7);
                }
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (uVar5 < (ulong)((long)mzp.entry_headers.
                                             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                       (long)mzp.header >> 3));
            }
            uVar7 = uVar8;
          } while (uVar8 < (ulong)((long)mzp.entry_headers.
                                         super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start -
                                   (long)mzp.header >> 3));
          iVar6 = 0;
        }
      }
      else {
        main_cold_2();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (mzp.header != (MzpArchiveHeader)0x0) {
        operator_delete((void *)mzp.header,
                        (long)mzp.entry_headers.
                              super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
      }
    }
    if (local_88 != (undefined1  [8])&archive_data._M_string_length) {
      operator_delete((void *)local_88,
                      CONCAT71(archive_data._M_string_length._1_7_,
                               (undefined1)archive_data._M_string_length) + 1);
    }
  }
  else {
    main_cold_1();
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    fprintf(stderr, "%s infile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  fprintf(stderr, "MZP archive of %lu elements:\n", mzp.entry_headers.size());
  for (auto &header : mzp.entry_headers) {
    header.print();
  }

  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    for (unsigned j = i + 1; j < mzp.entry_headers.size(); j++) {
      // Do these ranges overlap
      auto &entry_i = mzp.entry_headers[i];
      auto &entry_j = mzp.entry_headers[j];
      const uint32_t entry_i_start = entry_i.data_offset_relative();
      const uint32_t entry_i_end = entry_i_start + entry_i.entry_data_size();
      const uint32_t entry_j_start = entry_j.data_offset_relative();
      if (entry_j_start >= entry_i_start && entry_j_start <= entry_i_end) {
        fprintf(stderr, "Entry %u begins inside of entry %u\n", j, i);
      }
    }
  }

  return 0;
}